

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O2

int channel_mix_2_0_to_4_0(mixed_segment *segment)

{
  float fVar1;
  float fVar2;
  undefined8 *puVar3;
  uint32_t i;
  ulong uVar4;
  uint32_t frames;
  float *r;
  float *l;
  float *rr;
  float *rl;
  float *fr;
  float *fl;
  
  puVar3 = (undefined8 *)segment->data;
  frames = 0xffffffff;
  mixed_buffer_request_read(&l,&frames,(mixed_buffer *)*puVar3);
  mixed_buffer_request_read(&r,&frames,(mixed_buffer *)puVar3[1]);
  mixed_buffer_request_write(&fl,&frames,(mixed_buffer *)puVar3[0xe]);
  mixed_buffer_request_write(&fr,&frames,(mixed_buffer *)puVar3[0xf]);
  mixed_buffer_request_write(&rl,&frames,(mixed_buffer *)puVar3[0x10]);
  mixed_buffer_request_write(&rr,&frames,(mixed_buffer *)puVar3[0x11]);
  for (uVar4 = 0; frames != uVar4; uVar4 = uVar4 + 1) {
    fVar1 = l[uVar4];
    fVar2 = r[uVar4];
    fl[uVar4] = fVar1;
    fr[uVar4] = fVar2;
    rl[uVar4] = fVar1;
    rr[uVar4] = fVar2;
  }
  mixed_buffer_finish_read(frames,(mixed_buffer *)*puVar3);
  mixed_buffer_finish_read(frames,(mixed_buffer *)puVar3[1]);
  mixed_buffer_finish_write(frames,(mixed_buffer *)puVar3[0xe]);
  mixed_buffer_finish_write(frames,(mixed_buffer *)puVar3[0xf]);
  mixed_buffer_finish_write(frames,(mixed_buffer *)puVar3[0x10]);
  mixed_buffer_finish_write(frames,(mixed_buffer *)puVar3[0x11]);
  return 1;
}

Assistant:

VECTORIZE int channel_mix_2_0_to_4_0(struct mixed_segment *segment){
  struct channel_data *data = (struct channel_data *)segment->data;
  
  uint32_t frames = UINT32_MAX;
  float *restrict l, *restrict r, *restrict fl, *restrict fr, *restrict rl, *restrict rr;
  mixed_buffer_request_read(&l, &frames, data->in[MIXED_LEFT]);
  mixed_buffer_request_read(&r, &frames, data->in[MIXED_RIGHT]);
  mixed_buffer_request_write(&fl, &frames, data->out[MIXED_LEFT_FRONT]);
  mixed_buffer_request_write(&fr, &frames, data->out[MIXED_RIGHT_FRONT]);
  mixed_buffer_request_write(&rl, &frames, data->out[MIXED_LEFT_REAR]);
  mixed_buffer_request_write(&rr, &frames, data->out[MIXED_RIGHT_REAR]);
  for(uint32_t i=0; i<frames; ++i){
    float li = l[i];
    float ri = r[i];

    fl[i] = li;
    fr[i] = ri;
    rl[i] = li;
    rr[i] = ri;
  }
  mixed_buffer_finish_read(frames, data->in[MIXED_LEFT]);
  mixed_buffer_finish_read(frames, data->in[MIXED_RIGHT]);
  mixed_buffer_finish_write(frames, data->out[MIXED_LEFT_FRONT]);
  mixed_buffer_finish_write(frames, data->out[MIXED_RIGHT_FRONT]);
  mixed_buffer_finish_write(frames, data->out[MIXED_LEFT_REAR]);
  mixed_buffer_finish_write(frames, data->out[MIXED_RIGHT_REAR]);

  return 1;
}